

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollarea.cpp
# Opt level: O2

void __thiscall QScrollAreaPrivate::updateScrollBars(QScrollAreaPrivate *this)

{
  Representation RVar1;
  QAbstractScrollArea *this_00;
  Data *pDVar2;
  bool bVar3;
  int iVar4;
  Representation RVar5;
  Representation RVar6;
  uint uVar7;
  QSizePolicy QVar8;
  int iVar9;
  QSize QVar10;
  QSize QVar11;
  QSize QVar12;
  QSize QVar13;
  QLayout *pQVar14;
  Representation RVar15;
  Representation RVar16;
  Representation RVar17;
  ulong uVar18;
  QWidget *pQVar19;
  Representation RVar20;
  Representation RVar21;
  Representation step;
  Representation step_00;
  long in_FS_OFFSET;
  ulong local_68;
  QSize local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractScrollArea **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  bVar3 = QPointer::operator_cast_to_bool((QPointer *)&this->widget);
  if (!bVar3) goto LAB_004382ba;
  QVar10 = QWidget::size((this->super_QAbstractScrollAreaPrivate).viewport);
  QVar11 = QAbstractScrollArea::maximumViewportSize(this_00);
  pDVar2 = (this->widget).wp.d;
  if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
    pQVar19 = (QWidget *)0x0;
  }
  else {
    pQVar19 = (QWidget *)(this->widget).wp.value;
  }
  QVar12 = qSmartMinSize(pQVar19);
  RVar17 = QVar12.ht.m_i;
  pDVar2 = (this->widget).wp.d;
  if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
    pQVar19 = (QWidget *)0x0;
  }
  else {
    pQVar19 = (QWidget *)(this->widget).wp.value;
  }
  RVar1 = QVar11.ht.m_i;
  QVar13 = qSmartMaxSize(pQVar19,(Alignment)0x0);
  local_68 = (ulong)QVar13 >> 0x20;
  RVar21 = QVar12.wd.m_i;
  step = QVar10.ht.m_i;
  RVar15 = QVar11.wd.m_i;
  step_00 = QVar10.wd.m_i;
  RVar20.m_i = RVar21.m_i;
  if (this->resizable == true) {
    pQVar14 = QWidget::layout((QWidget *)(this->widget).wp.value);
    pQVar19 = (QWidget *)(this->widget).wp.value;
    if (pQVar14 == (QLayout *)0x0) {
      QVar8 = QWidget::sizePolicy(pQVar19);
      if (((uint)QVar8.field_0 >> 0x1d & 1) != 0) goto LAB_0043803f;
    }
    else {
      pQVar14 = QWidget::layout(pQVar19);
      iVar4 = (*(pQVar14->super_QLayoutItem)._vptr_QLayoutItem[9])(&pQVar14->super_QLayoutItem);
      if ((char)iVar4 != '\0') {
LAB_0043803f:
        if (RVar21.m_i < step_00.m_i) {
          RVar20.m_i = step_00.m_i;
        }
        RVar16.m_i = RVar17.m_i;
        if (RVar17.m_i < step.m_i) {
          RVar16.m_i = step.m_i;
        }
        RVar5 = QVar13.wd.m_i;
        if (RVar5.m_i <= RVar20.m_i) {
          RVar20.m_i = RVar5.m_i;
        }
        RVar6 = QVar13.ht.m_i;
        if (RVar6.m_i <= RVar16.m_i) {
          RVar16.m_i = RVar6.m_i;
        }
        uVar7 = (**(code **)(*(long *)(this->widget).wp.value + 0x80))();
        uVar18 = (ulong)uVar7;
        if ((this->super_QAbstractScrollAreaPrivate).vbarpolicy == ScrollBarAsNeeded) {
          iVar4 = (**(code **)(*(long *)&(((this->super_QAbstractScrollAreaPrivate).vbar)->
                                         super_QAbstractSlider).super_QWidget + 0x70))();
          if (RVar21.m_i < RVar15.m_i) {
            QVar12 = QVar11;
          }
          if (RVar17.m_i < RVar1.m_i) {
            RVar17.m_i = RVar1.m_i;
          }
          RVar21.m_i = QVar12.wd.m_i.m_i;
          if (RVar5.m_i <= QVar12.wd.m_i.m_i) {
            RVar21.m_i = RVar5.m_i;
          }
          if (RVar6.m_i <= RVar17.m_i) {
            RVar17.m_i = RVar6.m_i;
          }
          iVar9 = (**(code **)(*(long *)(this->widget).wp.value + 0x80))();
          if (iVar9 <= RVar1.m_i) {
            while( true ) {
              bVar3 = iVar4 == 0;
              iVar4 = iVar4 + -1;
              if (((int)uVar18 <= RVar1.m_i) || (bVar3)) break;
              RVar21.m_i = RVar21.m_i - 1;
              uVar7 = (**(code **)(*(long *)(this->widget).wp.value + 0x80))();
              uVar18 = (ulong)uVar7;
            }
          }
          uVar7 = (uint)uVar18;
          local_68 = (ulong)(uint)RVar17.m_i;
          if (RVar17.m_i <= (int)uVar7) {
            local_68 = uVar18;
          }
          QVar13.ht.m_i = 0;
          QVar13.wd.m_i = RVar21.m_i;
        }
        RVar17.m_i = uVar7;
        if ((int)uVar7 < RVar16.m_i) {
          RVar17.m_i = RVar16.m_i;
        }
      }
    }
  }
  RVar21 = QVar13.wd.m_i;
  if (this->resizable == true) {
    if ((((RVar20.m_i <= RVar15.m_i) && (RVar17.m_i <= RVar1.m_i)) && (RVar15.m_i <= RVar21.m_i)) &&
       (RVar1.m_i <= (int)local_68)) {
LAB_004381fd:
      step_00.m_i = RVar15.m_i;
      step.m_i = RVar1.m_i;
    }
  }
  else {
    QVar10 = QWidget::size((QWidget *)(this->widget).wp.value);
    if (QVar10.ht.m_i.m_i <= RVar1.m_i && QVar10.wd.m_i.m_i <= RVar15.m_i) goto LAB_004381fd;
  }
  if (this->resizable == true) {
    if (RVar20.m_i < step_00.m_i) {
      RVar20.m_i = step_00.m_i;
    }
    if (RVar17.m_i < step.m_i) {
      RVar17.m_i = step.m_i;
    }
    if (RVar21.m_i <= RVar20.m_i) {
      RVar20.m_i = RVar21.m_i;
    }
    uVar18 = (ulong)(uint)RVar17.m_i;
    if ((int)local_68 <= RVar17.m_i) {
      uVar18 = local_68;
    }
    local_40 = (QSize)((ulong)(uint)RVar20.m_i | uVar18 << 0x20);
    QWidget::resize((QWidget *)(this->widget).wp.value,&local_40);
  }
  QVar10 = QWidget::size((QWidget *)(this->widget).wp.value);
  QAbstractSlider::setRange
            (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,0,
             QVar10.wd.m_i.m_i - step_00.m_i);
  QAbstractSlider::setPageStep
            (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,step_00.m_i);
  QAbstractSlider::setRange
            (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,0,
             QVar10.ht.m_i.m_i - step.m_i);
  QAbstractSlider::setPageStep
            (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,step.m_i);
  updateWidgetPosition(this);
LAB_004382ba:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QScrollAreaPrivate::updateScrollBars()
{
    Q_Q(QScrollArea);
    if (!widget)
        return;
    QSize p = viewport->size();
    QSize m = q->maximumViewportSize();

    QSize min = qSmartMinSize(widget);
    QSize max = qSmartMaxSize(widget);

    if (resizable) {
        if ((widget->layout() ? widget->layout()->hasHeightForWidth() : widget->sizePolicy().hasHeightForWidth())) {
            QSize p_hfw = p.expandedTo(min).boundedTo(max);
            int h = widget->heightForWidth(p_hfw.width());
            // If the height we calculated requires a vertical scrollbar,
            // then we need to constrain the width and calculate the height again,
            // otherwise we end up flipping the scrollbar on and off all the time.
            if (vbarpolicy == Qt::ScrollBarAsNeeded) {
                int vbarWidth = vbar->sizeHint().width();
                QSize m_hfw = m.expandedTo(min).boundedTo(max);
                // is there any point in searching?
                if (widget->heightForWidth(m_hfw.width() - vbarWidth) <= m.height()) {
                    while (h > m.height() && vbarWidth) {
                        --vbarWidth;
                        --m_hfw.rwidth();
                        h = widget->heightForWidth(m_hfw.width());
                    }
                }
                max = QSize(m_hfw.width(), qMax(m_hfw.height(), h));
            }
            min = QSize(p_hfw.width(), qMax(p_hfw.height(), h));
        }
    }

    if ((resizable && m.expandedTo(min) == m && m.boundedTo(max) == m)
        || (!resizable && m.expandedTo(widget->size()) == m))
        p = m; // no scroll bars needed

    if (resizable)
        widget->resize(p.expandedTo(min).boundedTo(max));
    QSize v = widget->size();

    hbar->setRange(0, v.width() - p.width());
    hbar->setPageStep(p.width());
    vbar->setRange(0, v.height() - p.height());
    vbar->setPageStep(p.height());
    updateWidgetPosition();

}